

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_helper.cc
# Opt level: O0

int bio_socket_should_retry(int return_value)

{
  int iVar1;
  int return_value_local;
  
  iVar1 = bio_errno_should_retry(return_value);
  return iVar1;
}

Assistant:

int bio_socket_should_retry(int return_value) {
#if defined(OPENSSL_WINDOWS)
  return return_value == -1 && WSAGetLastError() == WSAEWOULDBLOCK;
#else
  // On POSIX platforms, sockets and fds are the same.
  return bio_errno_should_retry(return_value);
#endif
}